

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ps_alignment.c
# Opt level: O0

int ps_alignment_propagate(ps_alignment_t *al)

{
  ps_alignment_entry_t *ppVar1;
  ps_alignment_entry_t *ppVar2;
  ps_alignment_entry_t *went;
  ps_alignment_entry_t *pent_1;
  ps_alignment_entry_t *pent;
  ps_alignment_entry_t *sent;
  ps_alignment_entry_t *ppStack_18;
  int i;
  ps_alignment_entry_t *last_ent;
  ps_alignment_t *al_local;
  
  ppStack_18 = (ps_alignment_entry_t *)0x0;
  for (sent._4_4_ = 0; sent._4_4_ < (int)(uint)(al->state).n_ent; sent._4_4_ = sent._4_4_ + 1) {
    ppVar1 = (al->state).seq + sent._4_4_;
    ppVar2 = (al->sseq).seq + ppVar1->parent;
    if (ppVar2 != ppStack_18) {
      ppVar2->start = ppVar1->start;
      ppVar2->duration = 0;
      ppVar2->score = 0;
    }
    ppVar2->duration = ppVar1->duration + ppVar2->duration;
    ppVar2->score = ppVar1->score + ppVar2->score;
    ppStack_18 = ppVar2;
  }
  ppStack_18 = (ps_alignment_entry_t *)0x0;
  for (sent._4_4_ = 0; sent._4_4_ < (int)(uint)(al->sseq).n_ent; sent._4_4_ = sent._4_4_ + 1) {
    ppVar1 = (al->sseq).seq + sent._4_4_;
    ppVar2 = (al->word).seq + ppVar1->parent;
    if (ppVar2 != ppStack_18) {
      ppVar2->start = ppVar1->start;
      ppVar2->duration = 0;
      ppVar2->score = 0;
    }
    ppVar2->duration = ppVar1->duration + ppVar2->duration;
    ppVar2->score = ppVar1->score + ppVar2->score;
    ppStack_18 = ppVar2;
  }
  return 0;
}

Assistant:

int
ps_alignment_propagate(ps_alignment_t *al)
{
    ps_alignment_entry_t *last_ent = NULL;
    int i;

    /* Propagate duration up from states to phones. */
    for (i = 0; i < al->state.n_ent; ++i) {
        ps_alignment_entry_t *sent = al->state.seq + i;
        ps_alignment_entry_t *pent = al->sseq.seq + sent->parent;
        if (pent != last_ent) {
            pent->start = sent->start;
            pent->duration = 0;
            pent->score = 0;
        }
        pent->duration += sent->duration;
        pent->score += sent->score;
        last_ent = pent;
    }

    /* Propagate duration up from phones to words. */
    last_ent = NULL;
    for (i = 0; i < al->sseq.n_ent; ++i) {
        ps_alignment_entry_t *pent = al->sseq.seq + i;
        ps_alignment_entry_t *went = al->word.seq + pent->parent;
        if (went != last_ent) {
            went->start = pent->start;
            went->duration = 0;
            went->score = 0;
        }
        went->duration += pent->duration;
        went->score += pent->score;
        last_ent = went;
    }

    return 0;
}